

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

R_conflict5 millisToWithinRange(qint64 millis)

{
  int year;
  qint64 jd;
  longlong *plVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  optional<long_long> oVar6;
  R_conflict5 RVar7;
  YearMonthDay YVar8;
  _Storage<long_long,_true> local_38;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  jd = msecsToJulianDay(millis);
  YVar8 = QGregorianCalendar::partsFromJulian(jd);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  year = systemTimeYearMatching(YVar8.year);
  oVar6 = QGregorianCalendar::julianFromParts(year,YVar8.month,YVar8.day);
  local_38._M_value =
       oVar6.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  local_30 = (undefined1 *)
             CONCAT71(local_30._1_7_,
                      oVar6.super__Optional_base<long_long,_true,_true>._M_payload.
                      super__Optional_payload_base<long_long>._M_engaged);
  if (((undefined1  [16])
       oVar6.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    lVar3 = 0;
    uVar4 = 0;
  }
  else {
    plVar1 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
             _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *)
                    &local_38);
    lVar2 = *plVar1 - jd;
    bVar5 = SEXT816(lVar2 * 86400000) != SEXT816(lVar2) * SEXT416(86400000);
    lVar3 = lVar2 * 86400000;
    if (!bVar5) {
      lVar3 = lVar2 * 86400000 + millis;
    }
    uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar5 || SCARRY8(lVar2 * 86400000,millis)) ^ 1
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    RVar7._8_8_ = uVar4;
    RVar7.shifted = lVar3;
    return RVar7;
  }
  __stack_chk_fail();
}

Assistant:

static auto millisToWithinRange(qint64 millis)
{
    struct R {
        qint64 shifted = 0;
        bool good = false;
    } result;
    qint64 jd = msecsToJulianDay(millis);
    auto ymd = QGregorianCalendar::partsFromJulian(jd);
    const auto fakeJd = QGregorianCalendar::julianFromParts(systemTimeYearMatching(ymd.year),
                                                            ymd.month, ymd.day);
    result.good = fakeJd && !daysAndMillisOverflow(*fakeJd - jd, millis, &result.shifted);
    return result;
}